

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# empty_validity.cpp
# Opt level: O2

CompressionFunction *
duckdb::EmptyValidityCompressionFun::GetFunction
          (CompressionFunction *__return_storage_ptr__,PhysicalType type)

{
  EmptyValidityCompression::CreateFunction();
  return __return_storage_ptr__;
}

Assistant:

CompressionFunction EmptyValidityCompressionFun::GetFunction(PhysicalType type) {
	return EmptyValidityCompression::CreateFunction();
}